

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O3

void __thiscall
sing::TimerManager::addTimer
          (TimerManager *this,HttpContext *context,int timeout,function<void_()> *callback)

{
  long lVar1;
  Sha_Timer timer;
  undefined1 local_51;
  value_type local_50;
  element_type *local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  
  if (context != (HttpContext *)0x0) {
    lVar1 = std::chrono::_V2::system_clock::now();
    local_30.__d.__r = (duration)((long)timeout * 1000000 + lVar1);
    local_50.super___shared_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<sing::Timer,std::allocator<sing::Timer>,std::chrono::time_point<std::chrono::_V2::system_clock,std::chrono::duration<long,std::ratio<1l,1000000000l>>>,std::function<void()>const&>
              (&local_50.super___shared_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
               (Timer **)&local_50,(allocator<sing::Timer> *)&local_51,&local_30,callback);
    std::
    priority_queue<std::shared_ptr<sing::Timer>,_std::deque<std::shared_ptr<sing::Timer>,_std::allocator<std::shared_ptr<sing::Timer>_>_>,_sing::cmp>
    ::push(&this->timerQueue,&local_50);
    HttpContext::clearTimer(context);
    local_40 = local_50.super___shared_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_38._M_pi =
         local_50.super___shared_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    if (local_50.super___shared_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_50.super___shared_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_50.super___shared_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_50.super___shared_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
        _M_use_count = (local_50.super___shared_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    (context->timer).super___weak_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_50.super___shared_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(context->timer).super___weak_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&local_38);
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    }
    if (local_50.super___shared_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.super___shared_ptr<sing::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    return;
  }
  __assert_fail("context!=nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/MisakiOfScut[P]SingHttpServer/src/Timer/TimerManager.cpp"
                ,5,
                "void sing::TimerManager::addTimer(HttpContext *, int, const std::function<void ()> &)"
               );
}

Assistant:

void TimerManager::addTimer(HttpContext* context, int timeout, const std::function<void()>& callback){
    assert(context!=nullptr);
    Sha_Timer timer = std::make_shared<Timer>(Clock::now()+MS(timeout),callback);
    timerQueue.push(timer);
    context->clearTimer();
    context->setTimer(timer);
}